

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon_label.c
# Opt level: O2

void JPCommonLabel_fprint(JPCommonLabel *label,FILE *fp)

{
  JPCommonLabelBreathGroup *pJVar1;
  _JPCommonLabelAccentPhrase *p_Var2;
  _JPCommonLabelWord *p_Var3;
  _JPCommonLabelPhoneme *p_Var4;
  int iVar5;
  uint uVar6;
  JPCommonLabelBreathGroup *pJVar7;
  _JPCommonLabelWord **pp_Var8;
  _JPCommonLabelPhoneme **pp_Var9;
  uint uVar10;
  _JPCommonLabelWord *p_Var11;
  JPCommonLabelBreathGroup **ppJVar12;
  
  ppJVar12 = &label->breath_head;
  uVar6 = 0;
  iVar5 = 0;
  do {
    pJVar1 = *ppJVar12;
    if (pJVar1 == (JPCommonLabelBreathGroup *)0x0) {
      return;
    }
    iVar5 = iVar5 + 1;
    fprintf((FILE *)fp,"%d\n");
    pJVar7 = pJVar1;
    uVar10 = uVar6;
    do {
      p_Var2 = pJVar7->head;
      uVar6 = uVar10;
      if (p_Var2 == (_JPCommonLabelAccentPhrase *)0x0) break;
      uVar6 = uVar10 + 1;
      fprintf((FILE *)fp,"   %d\n",(ulong)uVar10);
      pp_Var8 = &p_Var2->head;
      do {
        p_Var3 = *pp_Var8;
        if (p_Var3 == (_JPCommonLabelWord *)0x0) break;
        fprintf((FILE *)fp,"      %s %s %s %s\n",p_Var3->pron,p_Var3->pos,p_Var3->ctype,
                p_Var3->cform,iVar5);
        p_Var11 = p_Var3;
        do {
          p_Var11 = (_JPCommonLabelWord *)p_Var11->head;
          if (p_Var11 == (_JPCommonLabelWord *)0x0) break;
          fprintf((FILE *)fp,"         %s\n",p_Var11->pron);
          pp_Var9 = (_JPCommonLabelPhoneme **)&p_Var11->pos;
          do {
            p_Var4 = *pp_Var9;
            if (p_Var4 == (_JPCommonLabelPhoneme *)0x0) break;
            fprintf((FILE *)fp,"            %s\n",p_Var4->phoneme);
            pp_Var9 = &p_Var4->next;
          } while (p_Var4 != (_JPCommonLabelPhoneme *)p_Var11->ctype);
        } while (p_Var11 != (_JPCommonLabelWord *)p_Var3->tail);
        pp_Var8 = &p_Var3->next;
      } while (p_Var3 != p_Var2->tail);
      pJVar7 = (JPCommonLabelBreathGroup *)&p_Var2->next;
      uVar10 = uVar6;
    } while (p_Var2 != pJVar1->tail);
    ppJVar12 = &pJVar1->next;
  } while( true );
}

Assistant:

void JPCommonLabel_fprint(JPCommonLabel * label, FILE * fp)
{
   JPCommonLabelPhoneme *p;
   JPCommonLabelMora *m;
   JPCommonLabelWord *w;
   JPCommonLabelAccentPhrase *a;
   JPCommonLabelBreathGroup *b;
   int i = 0;
   int j = 0;

   for (b = label->breath_head; b != NULL; b = b->next) {
      fprintf(fp, "%d\n", j++);
      for (a = b->head; a != NULL; a = a->next) {
         fprintf(fp, "   %d\n", i++);
         for (w = a->head; w != NULL; w = w->next) {
            fprintf(fp, "      %s %s %s %s\n", w->pron, w->pos, w->ctype, w->cform);
            for (m = w->head; m != NULL; m = m->next) {
               fprintf(fp, "         %s\n", m->mora);
               for (p = m->head; p != NULL; p = p->next) {
                  fprintf(fp, "            %s\n", p->phoneme);
                  if (p == m->tail)
                     break;
               }
               if (m == w->tail)
                  break;
            }
            if (w == a->tail)
               break;
         }
         if (a == b->tail)
            break;
      }
   }
}